

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O0

void deallocateMasterBarrierDisjunctInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)

{
  int iVar1;
  Vec_Int_t *p;
  undefined4 local_1c;
  int i;
  Vec_Int_t *vInt;
  Vec_Ptr_t *vMasterBarrierDisjunctsArg_local;
  
  if (vMasterBarrierDisjunctsArg != (Vec_Ptr_t *)0x0) {
    for (local_1c = 0; iVar1 = Vec_PtrSize(vMasterBarrierDisjunctsArg), local_1c < iVar1;
        local_1c = local_1c + 1) {
      p = (Vec_Int_t *)Vec_PtrEntry(vMasterBarrierDisjunctsArg,local_1c);
      Vec_IntFree(p);
    }
    Vec_PtrFree(vMasterBarrierDisjunctsArg);
  }
  return;
}

Assistant:

void deallocateMasterBarrierDisjunctInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)
{
	Vec_Int_t *vInt;
	int i;

	if(vMasterBarrierDisjunctsArg)
	{
		Vec_PtrForEachEntry(Vec_Int_t *, vMasterBarrierDisjunctsArg, vInt, i)
		{	
			Vec_IntFree(vInt);
		}
		Vec_PtrFree(vMasterBarrierDisjunctsArg);
	}
}